

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O3

SparseArray<Value> * SparseArray<Value>::New(ArenaAllocator *allocator,uint32 chunkSize)

{
  SparseArray<Value> *pSVar1;
  
  if (((int)chunkSize < 1) || ((chunkSize + 0x7fffffff & chunkSize) != 0)) {
    chunkSize = Math::NextPowerOf2(chunkSize);
  }
  if (chunkSize < 0x1ffffffe) {
    pSVar1 = (SparseArray<Value> *)new<Memory::ArenaAllocator>(0x18,allocator,0x364470);
    *(undefined8 *)&pSVar1->chunkSize = 0;
    pSVar1->firstChunk = (SAChunk<Value> *)0x0;
    pSVar1->alloc = allocator;
    pSVar1->chunkSize = chunkSize;
    return pSVar1;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

static SparseArray<T> * New(ArenaAllocator *allocator, uint32 chunkSize)
    {
        SparseArray<T> * array;

        if (!Math::IsPow2(chunkSize))
        {
            chunkSize = Math::NextPowerOf2(chunkSize);
        }

        // Throw early if this overflows, since chunkSize never changes, subsequent operations will be safe
        UInt32Math::MulAdd<sizeof(T*), sizeof(SAChunk<T>)>(chunkSize);
        array = Anew(allocator, SparseArray<T>);
        array->alloc = allocator;
        array->chunkSize = chunkSize;
        array->firstChunk = NULL;

        return array;
    }